

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O3

SSTableDataEntry * __thiscall
DiskTableNode::getEntry(SSTableDataEntry *__return_storage_ptr__,DiskTableNode *this,longlong key)

{
  IndexMap *pIVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  
  pIVar1 = this->index;
  if ((pIVar1 == (IndexMap *)0x0) ||
     ((pIVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    loadIndexFilter(this);
    pIVar1 = this->index;
  }
  p_Var4 = (pIVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var2 = &(pIVar1->_M_t)._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var2->_M_header;
    do {
      if (key <= *(long *)(p_Var4 + 1)) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(long *)(p_Var4 + 1) < key];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var2) && (*(long *)(p_Var3 + 1) <= key)) {
      SSTable::getEntry(__return_storage_ptr__,this->_sstable,(longlong)p_Var3[1]._M_parent);
      return __return_storage_ptr__;
    }
  }
  SSTableDataEntry::SSTableDataEntry(__return_storage_ptr__,false,0,0,"");
  return __return_storage_ptr__;
}

Assistant:

SSTableDataEntry DiskTableNode::getEntry(long long key) {
    auto *i = getIndex();
    auto p = i->find(key);
    if (p == i->end()) {
        return SSTableDataEntry{false, 0, 0, ""};
    }
    auto offset = p->second;
    return _sstable->getEntry(offset);
}